

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  anon_class_24_2_e8cc7173 __f;
  bool bVar1;
  anon_class_24_2_e8cc7173 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  reference pvStack_a8;
  to_string_fn *ptStack_a0;
  const_iterator local_98;
  const_iterator local_70;
  iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>,_const_ezy::to_string_fn_&>
  local_58;
  const_iterator local_40;
  undefined1 local_21;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
  *local_20;
  basic_string_view<char,_std::char_traits<char>_> *separator_local;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
  *range_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  local_20 = range;
  separator_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  range_local = (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
                 *)__return_storage_ptr__;
  bVar1 = empty_fn::operator()
                    ((empty_fn *)&cpo::empty,
                     (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
                      *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_21 = 0;
    std::
    begin<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>>
              (&local_40,
               (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
                *)separator_local);
    detail::
    iterator_adaptor<ezy::detail::drop_iterator<std::vector<int,std::allocator<int>>const>,ezy::to_string_fn_const&>
    ::operator*[abi_cxx11_(__return_storage_ptr__,&local_40);
    std::
    begin<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>>
              (&local_70,
               (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
                *)separator_local);
    std::
    next<ezy::detail::iterator_adaptor<ezy::detail::drop_iterator<std::vector<int,std::allocator<int>>const>,ezy::to_string_fn_const&>>
              (&local_58,&local_70,1);
    std::
    end<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>>
              (&local_98,
               (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
                *)separator_local);
    pvStack_a8 = (local_20->orig_range).t;
    ptStack_a0 = local_20->transformation;
    __f.separator._M_len = (size_t)pvStack_a8;
    __f.result = __return_storage_ptr__;
    __f.separator._M_str = (char *)ptStack_a0;
    local_b0 = __return_storage_ptr__;
    std::
    for_each<ezy::detail::iterator_adaptor<ezy::detail::drop_iterator<std::vector<int,std::allocator<int>>const>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
              (&local_c8,&local_58,&local_98,__f);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }